

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

void __thiscall
HighsHashTree<std::pair<int,_int>,_double>::InnerLeaf<2>::InnerLeaf<1>
          (InnerLeaf<2> *this,InnerLeaf<1> *other)

{
  const_iterator __n;
  HighsHashTableEntry<std::pair<int,_int>,_double> *__x;
  iterator __first;
  pair<int,_int> *in_RSI;
  HighsHashTableEntry<std::pair<int,_int>,_double> *in_RDI;
  unsigned_long *in_stack_ffffffffffffffd0;
  array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL> *in_stack_ffffffffffffffe0;
  
  Occupation::Occupation((Occupation *)in_RDI);
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL>::array
            (in_stack_ffffffffffffffe0);
  in_RDI->key_ = *in_RSI;
  *(int *)&in_RDI->value_ = in_RSI[1].first;
  __n = std::array<unsigned_long,_7UL>::cbegin((array<unsigned_long,_7UL> *)0x73c0d7);
  std::array<unsigned_long,_7UL>::cbegin((array<unsigned_long,_7UL> *)0x73c0e9);
  __x = (HighsHashTableEntry<std::pair<int,_int>,_double> *)
        std::next<unsigned_long_const*>(in_stack_ffffffffffffffd0,(difference_type)__n);
  std::array<unsigned_long,_23UL>::begin((array<unsigned_long,_23UL> *)0x73c112);
  std::copy<unsigned_long_const*,unsigned_long*>
            ((unsigned_long *)in_stack_ffffffffffffffe0,(unsigned_long *)in_RDI,(unsigned_long *)__x
            );
  __first = std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL>::begin
                      ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL> *)0x73c131);
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL>::begin
            ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_6UL> *)0x73c144);
  std::next<HighsHashTableEntry<std::pair<int,int>,double>*>(__x,(difference_type)__n);
  std::array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL>::begin
            ((array<HighsHashTableEntry<std::pair<int,_int>,_double>,_22UL> *)0x73c16b);
  std::
  move<HighsHashTableEntry<std::pair<int,int>,double>*,HighsHashTableEntry<std::pair<int,int>,double>*>
            (__first,in_RDI,__x);
  return;
}

Assistant:

InnerLeaf(InnerLeaf<kOtherSize>&& other) {
      assert(other.size <= capacity());
      occupation = other.occupation;
      size = other.size;
      std::copy(other.hashes.cbegin(),
                std::next(other.hashes.cbegin(), size + 1), hashes.begin());
      std::move(other.entries.begin(), std::next(other.entries.begin(), size),
                entries.begin());
    }